

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMBusTypes.cpp
# Opt level: O3

void __thiscall
SMBusPacket::CreateFramesForGroupCommand
          (SMBusPacket *this,SMBusAnalyzerResults *pResults,bool has_pec)

{
  pointer pSVar1;
  ulong uVar2;
  pointer pvVar3;
  pointer pSVar4;
  long lVar5;
  byte bVar6;
  Frame f;
  SMBusByte local_78;
  undefined1 local_58;
  undefined1 local_57;
  long local_50;
  SMBusAnalyzerResults *local_48;
  pointer local_40;
  SMBusPacket *local_38;
  
  pvVar3 = (this->chunks).
           super__Vector_base<std::vector<SMBusByte,_std::allocator<SMBusByte>_>,_std::allocator<std::vector<SMBusByte,_std::allocator<SMBusByte>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pvVar3 != (this->chunks).
                super__Vector_base<std::vector<SMBusByte,_std::allocator<SMBusByte>_>,_std::allocator<std::vector<SMBusByte,_std::allocator<SMBusByte>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    local_50 = -(ulong)has_pec;
    local_48 = pResults;
    local_38 = this;
    do {
      SMBusByte::ToAddrFrame
                (&local_78,
                 (SMBusProtocol *)
                 (pvVar3->super__Vector_base<SMBusByte,_std::allocator<SMBusByte>_>)._M_impl.
                 super__Vector_impl_data._M_start);
      AnalyzerResults::AddFrame((Frame *)pResults);
      Frame::~Frame((Frame *)&local_78);
      pSVar1 = (pvVar3->super__Vector_base<SMBusByte,_std::allocator<SMBusByte>_>)._M_impl.
               super__Vector_impl_data._M_start;
      bVar6 = ""[pSVar1->value];
      Frame::Frame((Frame *)&local_78);
      local_58 = 0xb;
      local_78._0_8_ =
           **(U64 **)&pSVar1[1].signals.
                      super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>.
                      _M_impl.super__Vector_impl_data;
      local_78.signals.super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)(*(pointer *)
                      ((long)&pSVar1[1].signals.
                              super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>
                              ._M_impl + 8))[-1].sample_end;
      local_78.signals.super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)(ulong)pSVar1[1].value;
      local_78.signals.super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_57 = pSVar1[1].is_acked;
      AnalyzerResults::AddFrame((Frame *)pResults);
      Frame::~Frame((Frame *)&local_78);
      pSVar1 = (pvVar3->super__Vector_base<SMBusByte,_std::allocator<SMBusByte>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pSVar4 = (pvVar3->super__Vector_base<SMBusByte,_std::allocator<SMBusByte>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      bVar6 = ""[bVar6 ^ pSVar1[1].value];
      local_40 = pvVar3;
      if (2 < (ulong)(((long)pSVar4 - (long)pSVar1 >> 5) + local_50)) {
        uVar2 = 2;
        lVar5 = 0x40;
        do {
          Frame::Frame((Frame *)&local_78);
          local_58 = 6;
          local_78._0_8_ =
               **(U64 **)((long)&(pSVar1->signals).
                                 super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>
                                 ._M_impl + lVar5);
          local_78.signals.super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>.
          _M_impl.super__Vector_impl_data._M_start =
               *(pointer *)
                (*(long *)((long)&(pSVar1->signals).
                                  super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>
                                  ._M_impl + lVar5 + 8) + -0x20);
          local_78.signals.super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)(ulong)(&pSVar1->value)[lVar5];
          local_78.signals.super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_57 = (&pSVar1->is_acked)[lVar5];
          AnalyzerResults::AddFrame((Frame *)local_48);
          Frame::~Frame((Frame *)&local_78);
          pSVar1 = (local_40->super__Vector_base<SMBusByte,_std::allocator<SMBusByte>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pSVar4 = (local_40->super__Vector_base<SMBusByte,_std::allocator<SMBusByte>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
          uVar2 = uVar2 + 1;
          bVar6 = ""[bVar6 ^ (&pSVar1->value)[lVar5]];
          lVar5 = lVar5 + 0x20;
        } while (uVar2 < (ulong)(((long)pSVar4 - (long)pSVar1 >> 5) + local_50));
      }
      pResults = local_48;
      if (has_pec) {
        Frame::Frame((Frame *)&local_78);
        local_58 = 9;
        local_78._0_8_ =
             (pSVar4[-1].signals.
              super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>._M_impl.
              super__Vector_impl_data._M_start)->sample_begin;
        local_78.signals.super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (pointer)pSVar4[-1].signals.
                      super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-1].sample_end;
        local_78.signals.super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)(ulong)pSVar4[-1].value;
        local_78.signals.super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(ulong)bVar6;
        local_57 = pSVar4[-1].is_acked;
        AnalyzerResults::AddFrame((Frame *)pResults);
        Frame::~Frame((Frame *)&local_78);
      }
      pvVar3 = local_40 + 1;
    } while (pvVar3 != (local_38->chunks).
                       super__Vector_base<std::vector<SMBusByte,_std::allocator<SMBusByte>_>,_std::allocator<std::vector<SMBusByte,_std::allocator<SMBusByte>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void SMBusPacket::CreateFramesForGroupCommand( SMBusAnalyzerResults* pResults, bool has_pec ) const
{
    for( std::vector<std::vector<SMBusByte>>::const_iterator ci( chunks.begin() ); ci != chunks.end(); ++ci )
    {
        const std::vector<SMBusByte>& chunk( *ci );

        U8 pec = 0;

        pResults->AddFrame( chunk.front().ToAddrFrame( NULL ) ); // addr
        pec = SMBusCRCLookup[ pec ^ chunk.front().value ];
        pResults->AddFrame( chunk[ 1 ].ToPMBusCommandFrame() ); // command
        pec = SMBusCRCLookup[ pec ^ chunk[ 1 ].value ];

        for( size_t bcnt = 2; bcnt < chunk.size() - ( has_pec ? 1 : 0 ); ++bcnt )
        {
            pResults->AddFrame( chunk[ bcnt ].ToDataByte() );
            pec = SMBusCRCLookup[ pec ^ chunk[ bcnt ].value ];
        }

        if( has_pec )
            pResults->AddFrame( chunk.back().ToPECFrame( pec ) );
    }
}